

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O2

Type tinyply::property_type_from_string(string *t)

{
  bool bVar1;
  Type TVar2;
  
  bVar1 = std::operator==(t,"int8");
  TVar2 = INT8;
  if (!bVar1) {
    bVar1 = std::operator==(t,"char");
    if (!bVar1) {
      bVar1 = std::operator==(t,"uint8");
      TVar2 = UINT8;
      if (!bVar1) {
        bVar1 = std::operator==(t,"uchar");
        if (!bVar1) {
          bVar1 = std::operator==(t,"int16");
          TVar2 = INT16;
          if (!bVar1) {
            bVar1 = std::operator==(t,"short");
            if (!bVar1) {
              bVar1 = std::operator==(t,"uint16");
              TVar2 = UINT16;
              if (!bVar1) {
                bVar1 = std::operator==(t,"ushort");
                if (!bVar1) {
                  bVar1 = std::operator==(t,"int32");
                  TVar2 = INT32;
                  if (!bVar1) {
                    bVar1 = std::operator==(t,"int");
                    if (!bVar1) {
                      bVar1 = std::operator==(t,"uint32");
                      TVar2 = UINT32;
                      if (!bVar1) {
                        bVar1 = std::operator==(t,"uint");
                        if (!bVar1) {
                          bVar1 = std::operator==(t,"float32");
                          TVar2 = FLOAT32;
                          if (!bVar1) {
                            bVar1 = std::operator==(t,"float");
                            if (!bVar1) {
                              bVar1 = std::operator==(t,"float64");
                              TVar2 = FLOAT64;
                              if (!bVar1) {
                                bVar1 = std::operator==(t,"double");
                                TVar2 = bVar1 << 3;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

inline Type property_type_from_string(const std::string & t) noexcept
{
    if (t == "int8" || t == "char")           return Type::INT8;
    else if (t == "uint8" || t == "uchar")    return Type::UINT8;
    else if (t == "int16" || t == "short")    return Type::INT16;
    else if (t == "uint16" || t == "ushort")  return Type::UINT16;
    else if (t == "int32" || t == "int")      return Type::INT32;
    else if (t == "uint32" || t == "uint")    return Type::UINT32;
    else if (t == "float32" || t == "float")  return Type::FLOAT32;
    else if (t == "float64" || t == "double") return Type::FLOAT64;
    return Type::INVALID;
}